

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

Logger * google::base::GetLogger(LogSeverity severity)

{
  Logger *pLVar1;
  LogDestination *pLVar2;
  undefined8 unaff_RBX;
  
  std::mutex::lock((mutex *)log_mutex);
  pLVar2 = LogDestination::log_destination((LogSeverity)((ulong)unaff_RBX >> 0x20));
  pLVar1 = pLVar2->logger_;
  pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
  return pLVar1;
}

Assistant:

base::Logger* base::GetLogger(LogSeverity severity) {
  std::lock_guard<std::mutex> l{log_mutex};
  return LogDestination::log_destination(severity)->GetLoggerImpl();
}